

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

void __thiscall
Diligent::DearchiverBase::UnpackPipelineStateImpl<Diligent::TilePipelineStateCreateInfo>
          (DearchiverBase *this,PipelineStateUnpackInfo *UnpackInfo,IPipelineState **ppPSO)

{
  bool bVar1;
  int iVar2;
  PSO_CREATE_INTERNAL_FLAGS PVar3;
  Char *Message;
  IMemoryAllocator *Allocator;
  pointer this_00;
  undefined4 extraout_var;
  char (*in_RCX) [30];
  undefined1 local_180 [8];
  PSOData<Diligent::TilePipelineStateCreateInfo> PSO;
  ArchiveData *pArchiveData;
  ResourceType ResType;
  undefined1 local_40 [8];
  string msg;
  IPipelineState **ppPSO_local;
  PipelineStateUnpackInfo *UnpackInfo_local;
  DearchiverBase *this_local;
  
  msg.field_2._8_8_ = ppPSO;
  if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[30]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"UnpackInfo.pDevice != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"UnpackPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x254);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (((UnpackInfo->ModifyPipelineStateCreateInfo !=
        (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) ||
      (bVar1 = NamedResourceCache<Diligent::IPipelineState>::Get
                         (&(this->m_Cache).PSO,TilePipeline,UnpackInfo->Name,
                          (IPipelineState **)msg.field_2._8_8_), !bVar1)) &&
     (PSO.Shaders.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)FindArchive(this,TilePipeline,UnpackInfo->Name),
     (ArchiveData *)
     PSO.Shaders.
     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
     ._M_impl.super__Vector_impl_data._M_end_of_storage != (ArchiveData *)0x0)) {
    Allocator = GetRawAllocator();
    PSOData<Diligent::TilePipelineStateCreateInfo>::PSOData
              ((PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180,Allocator,0x800);
    this_00 = std::
              unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
              ::operator->((unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                            *)PSO.Shaders.
                              super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    PVar3 = 6;
    bVar1 = DeviceObjectArchive::
            LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::TilePipelineStateCreateInfo>>
                      (this_00,TilePipeline,UnpackInfo->Name,
                       (PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180);
    if (bVar1) {
      iVar2 = (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0x18])();
      bVar1 = RenderDeviceInfo::IsD3DDevice((RenderDeviceInfo *)CONCAT44(extraout_var,iVar2));
      if (bVar1) {
        PVar3 = operator~((Diligent *)0x2,PVar3);
        operator&=((PSO_CREATE_INTERNAL_FLAGS *)&PSO.CreateInfo.pTS,PVar3);
      }
      bVar1 = UnpackPSORenderPass<Diligent::TilePipelineStateCreateInfo>
                        (this,(PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180,
                         UnpackInfo->pDevice);
      if (((bVar1) &&
          (bVar1 = UnpackPSOSignatures<Diligent::TilePipelineStateCreateInfo>
                             (this,(PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180,
                              UnpackInfo->pDevice), bVar1)) &&
         (bVar1 = UnpackPSOShaders<Diligent::TilePipelineStateCreateInfo>
                            (this,(ArchiveData *)
                                  PSO.Shaders.
                                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180,
                             UnpackInfo->pDevice), bVar1)) {
        PSOData<Diligent::TilePipelineStateCreateInfo>::AssignShaders
                  ((PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180);
        PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.super_DeviceObjectAttribs.Name._4_4_ =
             UnpackInfo->SRBAllocationGranularity;
        PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc._8_8_ =
             UnpackInfo->ImmediateContextMask;
        PSO.CreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures =
             (IPipelineResourceSignature **)UnpackInfo->pCache;
        bVar1 = ModifyPipelineStateCreateInfo<Diligent::TilePipelineStateCreateInfo>
                          ((TilePipelineStateCreateInfo *)&PSO.Allocator.m_pAllocator,UnpackInfo);
        if ((bVar1) &&
           (PSOData<Diligent::TilePipelineStateCreateInfo>::CreatePipeline
                      ((PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180,
                       UnpackInfo->pDevice,(IPipelineState **)msg.field_2._8_8_),
           UnpackInfo->ModifyPipelineStateCreateInfo ==
           (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0)) {
          NamedResourceCache<Diligent::IPipelineState>::Set
                    (&(this->m_Cache).PSO,TilePipeline,UnpackInfo->Name,
                     *(IPipelineState **)msg.field_2._8_8_);
        }
      }
    }
    PSOData<Diligent::TilePipelineStateCreateInfo>::~PSOData
              ((PSOData<Diligent::TilePipelineStateCreateInfo> *)local_180);
  }
  return;
}

Assistant:

void DearchiverBase::UnpackPipelineStateImpl(const PipelineStateUnpackInfo& UnpackInfo,
                                             IPipelineState**               ppPSO)
{
    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);

    constexpr auto ResType = PSOData<CreateInfoType>::ArchiveResType;

    // Do not cache modified PSOs
    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
    {
        // Since PSO names must be unique (for each PSO type), we use a single cache for all
        // loaded archives.
        if (m_Cache.PSO.Get(ResType, UnpackInfo.Name, ppPSO))
            return;
    }

    // Find the archive that contains this PSO
    ArchiveData* pArchiveData = FindArchive(ResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    PSOData<CreateInfoType> PSO{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(ResType, UnpackInfo.Name, PSO))
        return;

#ifdef DILIGENT_DEVELOPMENT
    if (UnpackInfo.pDevice->GetDeviceInfo().IsD3DDevice())
    {
        // We always have reflection information in Direct3D shaders, so always
        // load it in development build to allow the engine verify bindings.
        PSO.InternalCI.Flags &= ~PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION;
    }
#endif

    if (!UnpackPSORenderPass(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOSignatures(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOShaders(*pArchiveData, PSO, UnpackInfo.pDevice))
        return;

    PSO.AssignShaders();

    PSO.CreateInfo.PSODesc.SRBAllocationGranularity = UnpackInfo.SRBAllocationGranularity;
    PSO.CreateInfo.PSODesc.ImmediateContextMask     = UnpackInfo.ImmediateContextMask;
    PSO.CreateInfo.pPSOCache                        = UnpackInfo.pCache;

    if (!ModifyPipelineStateCreateInfo(PSO.CreateInfo, UnpackInfo))
        return;

    PSO.CreatePipeline(UnpackInfo.pDevice, ppPSO);

    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
        m_Cache.PSO.Set(ResType, UnpackInfo.Name, *ppPSO);
}